

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_sem.c
# Opt level: O1

QcSem * qc_sem_open(char *name,QcErr *err)

{
  size_t sVar1;
  sem_t *psVar2;
  QcSem *__dest;
  char *fmt;
  void *__ptr;
  
  sVar1 = strlen(name);
  if (sVar1 < 0x81) {
    psVar2 = sem_open(name,0);
    if (psVar2 != (sem_t *)0x0) {
      __ptr = (void *)0x98;
      __dest = (QcSem *)malloc(0x98);
      if (__dest != (QcSem *)0x0) {
        memset(__dest,0,0x98);
        __dest->sem = (sem_t *)psVar2;
        strncpy((char *)__dest,name,0x80);
        __dest->flags = 0;
        return __dest;
      }
      qc_sem_open_cold_1();
      sem_close(*(sem_t **)((long)__ptr + 0x88));
      free(__ptr);
      return (QcSem *)0x0;
    }
    fmt = "open sem (name : %s) failed.";
  }
  else {
    fmt = "parameter name (%s) is too long.";
  }
  qc_seterr(err,-1,fmt,name);
  return (QcSem *)0x0;
}

Assistant:

QcSem* qc_sem_open(const char *name, QcErr *err)
{
    int flags;
    sem_t *sem;

    flags = 0;  //just open

	if (strlen(name) > QC_SEMNAME_MAXLEN)
	{
		qc_seterr(err, -1, "parameter name (%s) is too long.", name);
		return NULL;
	}

    sem = sem_open(name, flags);
    if(NULL == sem)
    {
        qc_seterr(err, -1, "open sem (name : %s) failed.", name);
        return NULL;
    }

    QcSem *qcSem;

    qc_malloc(qcSem, sizeof(QcSem));
    qcSem->sem = sem;
    strncpy(qcSem->name, name, QC_SEMNAME_MAXLEN);
    qcSem->flags = flags;

    return qcSem;
}